

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripser.cc
# Opt level: O3

int main(int argc,char **argv)

{
  uint uVar1;
  uint uVar2;
  pointer pfVar3;
  char *pcVar4;
  float fVar5;
  int iVar6;
  uint uVar7;
  undefined8 in_RAX;
  long lVar8;
  int *piVar9;
  pointer pvVar10;
  ostream *poVar11;
  size_t sVar12;
  undefined8 extraout_RAX;
  uint uVar13;
  uint uVar14;
  file_format format;
  istream *piVar15;
  uint uVar16;
  uint uVar17;
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  *this;
  anon_class_1_0_00000001 *in_R8;
  anon_class_4_1_a88e3f2b *in_R9;
  int iVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  anon_class_4_1_a88e3f2b output_pair;
  string parameter;
  ifstream file_stream;
  float local_350;
  float local_34c;
  Compressed_lower_distance_matrix local_348;
  undefined8 local_310;
  char **local_308;
  long local_300;
  float local_2f4;
  char *local_2f0;
  double local_2e8;
  Euclidean_distance_matrix local_2e0;
  Compressed_distance_matrix<Params,_(Gudhi::ripser::Compressed_matrix_layout)0> local_2c8;
  Sparse_distance_matrix<Params> local_298;
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  local_278;
  pointer ppfStack_260;
  vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
  local_258;
  pointer ppfStack_240;
  long *local_238 [2];
  long local_228 [2];
  byte abStack_218 [488];
  
  local_2e8 = (double)CONCAT44(local_2e8._4_4_,argc);
  if (argc < 2) {
    std::ifstream::ifstream(local_238,(char *)0x0,_S_in);
    local_34c = 1.0;
    piVar15 = (istream *)&std::cin;
    uVar16 = 1;
    local_350 = 3.4028235e+38;
    uVar7 = 2;
    format = DISTANCE_MATRIX;
LAB_00103beb:
    read_file(&local_348,piVar15,format);
    fVar21 = INFINITY;
    if ((3.4028235e+38 <= local_350) &&
       (uVar13 = (uint)((ulong)((long)local_348.rows.
                                      super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                               (long)local_348.rows.
                                     super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 3), 0 < (int)uVar13)) {
      fVar21 = INFINITY;
      uVar14 = 0;
      do {
        uVar17 = 0;
        fVar20 = -INFINITY;
        do {
          fVar22 = 0.0;
          if (uVar14 != uVar17) {
            uVar1 = uVar17;
            if ((int)uVar17 < (int)uVar14) {
              uVar1 = uVar14;
            }
            uVar2 = uVar17;
            if ((int)uVar14 < (int)uVar17) {
              uVar2 = uVar14;
            }
            in_R8 = (anon_class_1_0_00000001 *)(ulong)uVar2;
            fVar22 = local_348.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar1][(long)in_R8];
          }
          if (fVar22 <= fVar20) {
            fVar22 = fVar20;
          }
          fVar20 = fVar22;
          uVar17 = uVar17 + 1;
        } while (uVar13 != uVar17);
        if (fVar21 <= fVar20) {
          fVar20 = fVar21;
        }
        fVar21 = fVar20;
        uVar14 = uVar14 + 1;
      } while (uVar14 != uVar13);
    }
    local_300 = CONCAT44(local_300._4_4_,fVar21);
    if (local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_2e8 = INFINITY;
      local_308 = (char **)0xfff0000000000000;
    }
    else {
      fVar20 = -INFINITY;
      fVar21 = INFINITY;
      pvVar10 = (pointer)local_348.distances.super__Vector_base<float,_std::allocator<float>_>.
                         _M_impl.super__Vector_impl_data._M_start;
      do {
        fVar22 = *(float *)&(pvVar10->
                            super__Vector_base<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>
                            )._M_impl.super__Vector_impl_data._M_start;
        fVar5 = fVar22;
        if (fVar22 == INFINITY || fVar22 <= fVar20) {
          fVar5 = fVar20;
        }
        fVar20 = fVar5;
        if (fVar21 <= fVar22) {
          fVar22 = fVar21;
        }
        fVar21 = fVar22;
        pvVar10 = (pointer)((long)&(pvVar10->
                                   super__Vector_base<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>
                                   )._M_impl.super__Vector_impl_data._M_start + 4);
      } while (pvVar10 !=
               (pointer)local_348.distances.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_finish);
      local_2e8 = (double)fVar21;
      local_308 = (char **)(double)fVar20;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"value range: [",0xe);
    poVar11 = std::ostream::_M_insert<double>(local_2e8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,",",1);
    poVar11 = std::ostream::_M_insert<double>((double)local_308);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    if (3.4028235e+38 <= local_350) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"distance matrix with ",0x15);
      poVar11 = (ostream *)
                std::ostream::operator<<
                          ((ostream *)&std::cout,
                           (int)((ulong)((long)local_348.rows.
                                               super__Vector_base<float_*,_std::allocator<float_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_348.rows.
                                              super__Vector_base<float_*,_std::allocator<float_*>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3));
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11," points, using threshold at enclosing radius ",0x2d);
      poVar11 = std::ostream::_M_insert<double>((double)(float)local_300);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      local_2c8.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_2c8.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_2c8.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_348.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_348.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_348.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_348.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_348.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_348.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      if (uVar7 == 2) {
        Gudhi::ripser::
        help1<false,Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,main::__0&,main::__1&>
                  (&local_2c8,uVar16,(float)local_300,(uint)&local_34c,
                   (anon_class_1_0_00000001 *)0x0,(anon_class_4_1_a88e3f2b *)in_R8);
      }
      else {
        Gudhi::ripser::
        help1<true,Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>,main::__0&,main::__1&>
                  (&local_2c8,uVar16,(float)local_300,uVar7,(anon_class_1_0_00000001 *)&local_34c,
                   (anon_class_4_1_a88e3f2b *)in_R8);
      }
      if (local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl
                        .super__Vector_impl_data._M_start,
                        (long)local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2c8.rows.super__Vector_base<float_*,_std::allocator<float_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if ((pointer)local_2c8.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_2c8.distances.super__Vector_base<float,_std::allocator<float>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_2c8.distances.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_2c8.distances.super__Vector_base<float,_std::allocator<float>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"sparse distance matrix with ",0x1c);
      poVar11 = (ostream *)
                std::ostream::operator<<
                          ((ostream *)&std::cout,
                           (int)((ulong)((long)local_348.rows.
                                               super__Vector_base<float_*,_std::allocator<float_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_348.rows.
                                              super__Vector_base<float_*,_std::allocator<float_*>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," points and ",0xc);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"/",1);
      iVar18 = (int)((ulong)((long)local_348.rows.
                                   super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)local_348.rows.
                                  super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3);
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,((iVar18 + -1) * iVar18) / 2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," entries",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      Gudhi::ripser::Sparse_distance_matrix<Params>::
      Sparse_distance_matrix<Gudhi::ripser::Compressed_distance_matrix<Params,(Gudhi::ripser::Compressed_matrix_layout)0>>
                (&local_298,&local_348,local_350);
      Gudhi::ripser::ripser<Gudhi::ripser::Sparse_distance_matrix<Params>,main::__0&,main::__1&>
                ((ripser *)&local_298,(Sparse_distance_matrix<Params> *)(ulong)uVar16,uVar7,
                 local_350,(uint)&local_34c,in_R8,in_R9);
      std::
      vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
      ::~vector(&local_298.neighbors);
    }
    if (local_348.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_348.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_348.rows.super__Vector_base<float_*,_std::allocator<float_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_348.rows.super__Vector_base<float_*,_std::allocator<float_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((pointer)local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_348.distances.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_348.distances.super__Vector_base<float,_std::allocator<float>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  else {
    local_300 = CONCAT71((int7)((ulong)in_RAX >> 8),1);
    local_350 = 3.4028235e+38;
    local_2f4 = 1.0;
    uVar19 = 2;
    iVar18 = 1;
    local_2f0 = (char *)0x0;
    local_310 = 2;
    local_308 = argv;
    do {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_238,argv[iVar18],(allocator<char> *)&local_348);
      iVar6 = std::__cxx11::string::compare((char *)local_238);
      if (iVar6 == 0) {
        iVar18 = 0;
        goto LAB_001042e3;
      }
      iVar6 = std::__cxx11::string::compare((char *)local_238);
      if (iVar6 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_348,argv[(long)iVar18 + 1],(allocator<char> *)&local_2e0);
        pfVar3 = local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar9 = __errno_location();
        iVar6 = *piVar9;
        *piVar9 = 0;
        lVar8 = strtol((char *)pfVar3,(char **)&local_2e0,10);
        if (local_2e0.points.
            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)pfVar3) goto LAB_001042fc;
        if (*piVar9 == 0x22) goto LAB_00104308;
        if (*piVar9 == 0) {
          *piVar9 = iVar6;
        }
        local_300 = lVar8;
        if ((pointer)((long)local_2e0.points.
                            super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start - (long)pfVar3) !=
            (pointer)local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish) goto LAB_001042f2;
        argv = local_308;
        if ((pointer *)
            local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
LAB_00103849:
          operator_delete(local_348.distances.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&(((_Vector_base<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>
                                            *)local_348.distances.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_impl).super__Vector_impl_data._M_start + 1));
        }
LAB_00103856:
        iVar18 = iVar18 + 1;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)local_238);
        if (iVar6 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_348,argv[(long)iVar18 + 1],(allocator<char> *)&local_2e0);
          pfVar3 = local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar9 = __errno_location();
          iVar6 = *piVar9;
          *piVar9 = 0;
          local_350 = strtof((char *)pfVar3,(char **)&local_2e0);
          if (local_2e0.points.
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == (pointer)pfVar3) goto LAB_0010432a;
          if (*piVar9 == 0x22) goto LAB_0010431e;
          if (*piVar9 == 0) {
            *piVar9 = iVar6;
          }
          if ((pointer)((long)local_2e0.points.
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)pfVar3) !=
              (pointer)local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl
                       .super__Vector_impl_data._M_finish) goto LAB_00104314;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)local_238);
          if (iVar6 != 0) {
            iVar6 = std::__cxx11::string::compare((char *)local_238);
            if (iVar6 == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_348,argv[(long)iVar18 + 1],(allocator<char> *)&local_2e0);
              local_310 = 0;
              lVar8 = std::__cxx11::string::rfind((char *)&local_348,0x13c627,0);
              if (lVar8 != 0) {
                lVar8 = std::__cxx11::string::rfind((char *)&local_348,0x13c62d,0);
                if (lVar8 == 0) {
                  local_310 = 1;
                }
                else {
                  lVar8 = std::__cxx11::string::rfind((char *)&local_348,0x13c633,0);
                  if (lVar8 == 0) {
                    local_310 = 2;
                  }
                  else {
                    lVar8 = std::__cxx11::string::rfind((char *)&local_348,0x13c638,0);
                    if (lVar8 == 0) {
                      local_310 = 3;
                    }
                    else {
                      iVar6 = std::__cxx11::string::compare((char *)&local_348);
                      if (iVar6 == 0) {
                        local_310 = 4;
                      }
                      else {
                        iVar6 = std::__cxx11::string::compare((char *)&local_348);
                        if (iVar6 == 0) {
                          local_310 = 5;
                        }
                        else {
                          iVar6 = std::__cxx11::string::compare((char *)&local_348);
                          local_310 = 6;
                          if (iVar6 != 0) {
                            print_usage_and_exit(-1);
                            std::
                            vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                            ::~vector(&local_278);
                            std::
                            vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                            ::~vector((vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
                                       *)&local_348);
                            std::ifstream::~ifstream(local_238);
                            _Unwind_Resume(extraout_RAX);
                          }
                        }
                      }
                    }
                  }
                }
              }
LAB_00103b92:
              if ((pointer *)
                  local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start !=
                  &local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage) goto LAB_00103849;
              goto LAB_00103856;
            }
            iVar6 = std::__cxx11::string::compare((char *)local_238);
            if (iVar6 != 0) {
              if (local_2f0 != (char *)0x0) goto LAB_00104358;
              local_2f0 = argv[iVar18];
              goto LAB_00103984;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_348,argv[(long)iVar18 + 1],(allocator<char> *)&local_2e0);
            pfVar3 = local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar9 = __errno_location();
            iVar6 = *piVar9;
            *piVar9 = 0;
            uVar19 = strtol((char *)pfVar3,(char **)&local_2e0,10);
            if (local_2e0.points.
                super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)pfVar3) {
              if (*piVar9 != 0x22) {
                if (*piVar9 == 0) {
                  *piVar9 = iVar6;
                }
                if ((pointer)((long)local_2e0.points.
                                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)pfVar3) !=
                    (pointer)local_348.distances.super__Vector_base<float,_std::allocator<float>_>.
                             _M_impl.super__Vector_impl_data._M_finish) goto LAB_001042e8;
                uVar16 = (uint)uVar19;
                argv = local_308;
                if (uVar16 < 2 || (uVar19 & 1) == 0) {
                  if (uVar16 != 2) goto LAB_001042e8;
                }
                else if (8 < uVar16) {
                  iVar6 = 5;
                  do {
                    if ((int)((uVar19 & 0xffffffff) % (ulong)(iVar6 - 2)) == 0) goto LAB_001042e8;
                    uVar7 = iVar6 * iVar6;
                    iVar6 = iVar6 + 2;
                  } while (uVar7 <= uVar16);
                }
                goto LAB_00103b92;
              }
              std::__throw_out_of_range("stol");
            }
            std::__throw_invalid_argument("stol");
            goto LAB_00104377;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_348,argv[(long)iVar18 + 1],(allocator<char> *)&local_2e0);
          pfVar3 = local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar9 = __errno_location();
          iVar6 = *piVar9;
          *piVar9 = 0;
          fVar21 = strtof((char *)pfVar3,(char **)&local_2e0);
          if (local_2e0.points.
              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == (pointer)pfVar3) goto LAB_0010434c;
          if (*piVar9 == 0x22) goto LAB_00104340;
          if (*piVar9 == 0) {
            *piVar9 = iVar6;
          }
          local_2f4 = fVar21;
          if ((pointer)((long)local_2e0.points.
                              super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start - (long)pfVar3) !=
              (pointer)local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl
                       .super__Vector_impl_data._M_finish) {
            do {
              print_usage_and_exit(-1);
LAB_00104340:
              std::__throw_out_of_range("stof");
LAB_0010434c:
              std::__throw_invalid_argument("stof");
LAB_00104358:
              iVar18 = -1;
LAB_001042e3:
              print_usage_and_exit(iVar18);
LAB_001042e8:
              print_usage_and_exit(-1);
LAB_001042f2:
              print_usage_and_exit(-1);
LAB_001042fc:
              std::__throw_invalid_argument("stol");
LAB_00104308:
              std::__throw_out_of_range("stol");
LAB_00104314:
              print_usage_and_exit(-1);
LAB_0010431e:
              std::__throw_out_of_range("stof");
LAB_0010432a:
              std::__throw_invalid_argument("stof");
            } while( true );
          }
        }
        argv = local_308;
        if ((pointer *)
            local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start !=
            &local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_348.distances.super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (ulong)((long)&(((_Vector_base<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>
                                            *)local_348.distances.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage)->
                                         _M_impl).super__Vector_impl_data._M_start + 1));
        }
        iVar18 = iVar18 + 1;
      }
LAB_00103984:
      uVar7 = (uint)uVar19;
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      pcVar4 = local_2f0;
      iVar18 = iVar18 + 1;
    } while (iVar18 < local_2e8._0_4_);
    piVar15 = (istream *)local_238;
    std::ifstream::ifstream(piVar15,local_2f0,_S_in);
    if ((pcVar4 != (char *)0x0) && ((abStack_218[local_238[0][-3]] & 5) != 0)) {
LAB_00104377:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"couldn\'t open file ",0x13);
      pcVar4 = local_2f0;
      sVar12 = strlen(local_2f0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar4,sVar12);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      exit(-1);
    }
    uVar16 = (uint)(char)local_300;
    local_34c = local_2f4;
    format = (file_format)local_310;
    if (format == POINT_CLOUD) {
      format = POINT_CLOUD;
      if (3.4028235e+38 <= local_350) goto LAB_0010421b;
      if (pcVar4 == (char *)0x0) {
        piVar15 = (istream *)&std::cin;
      }
      else {
        piVar15 = (istream *)local_238;
      }
      read_point_cloud(&local_2e0,piVar15);
      Gudhi::ripser::Sparse_distance_matrix<Params>::
      Sparse_distance_matrix<Gudhi::ripser::Euclidean_distance_matrix<Params>>
                ((Sparse_distance_matrix<Params> *)&local_348,&local_2e0,local_350);
      std::
      vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ::~vector(&local_2e0.points);
      local_278.
      super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_278.
      super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_278.
      super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      ppfStack_260 = local_348.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
      local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Gudhi::ripser::ripser<Gudhi::ripser::Sparse_distance_matrix<Params>,main::__0&,main::__1&>
                ((ripser *)&local_278,(Sparse_distance_matrix<Params> *)(ulong)uVar16,uVar7,
                 local_350,(uint)&local_34c,in_R8,in_R9);
      this = &local_278;
    }
    else {
      if (format != SPARSE) {
LAB_0010421b:
        if (pcVar4 == (char *)0x0) {
          piVar15 = (istream *)&std::cin;
        }
        else {
          piVar15 = (istream *)local_238;
        }
        goto LAB_00103beb;
      }
      if (pcVar4 == (char *)0x0) {
        piVar15 = (istream *)&std::cin;
      }
      read_sparse_distance_matrix((Sparse_distance_matrix *)&local_348,piVar15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"sparse distance matrix with ",0x1c);
      poVar11 = (ostream *)
                std::ostream::operator<<
                          ((ostream *)&std::cout,
                           (int)((ulong)((long)local_348.distances.
                                               super__Vector_base<float,_std::allocator<float>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_348.distances.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3) *
                           -0x55555555);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," points and ",0xc);
      poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"/",1);
      iVar18 = (int)((ulong)((long)local_348.distances.
                                   super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)local_348.distances.
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      poVar11 = (ostream *)std::ostream::operator<<(poVar11,((iVar18 + -1) * iVar18) / 2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," entries",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      local_258.
      super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_258.
      super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      local_258.
      super__Vector_base<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      ppfStack_240 = local_348.rows.super__Vector_base<float_*,_std::allocator<float_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
      local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_348.distances.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Gudhi::ripser::ripser<Gudhi::ripser::Sparse_distance_matrix<Params>,main::__0&,main::__1&>
                ((ripser *)&local_258,(Sparse_distance_matrix<Params> *)(ulong)uVar16,uVar7,
                 local_350,(uint)&local_34c,in_R8,in_R9);
      this = &local_258;
    }
    std::
    vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ::~vector(this);
    std::
    vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
    ::~vector((vector<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>,_std::allocator<std::vector<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t,_std::allocator<Gudhi::ripser::Sparse_distance_matrix<Params>::vertex_diameter_t>_>_>_>
               *)&local_348);
  }
  std::ifstream::~ifstream(local_238);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  const char* filename = nullptr;

  file_format format = DISTANCE_MATRIX;

  dimension_t dim_max = 1;
  value_t threshold = std::numeric_limits<value_t>::max();
  float ratio = 1;
  coefficient_t modulus = 2;

  for (int i = 1; i < argc; ++i) {
    const std::string arg(argv[i]);
    if (arg == "--help") {
      print_usage_and_exit(0);
    } else if (arg == "--dim") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      dim_max = std::stol(parameter, &next_pos);
      if (next_pos != parameter.size()) print_usage_and_exit(-1);
    } else if (arg == "--threshold") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      threshold = std::stof(parameter, &next_pos);
      if (next_pos != parameter.size()) print_usage_and_exit(-1);
    } else if (arg == "--ratio") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      ratio = std::stof(parameter, &next_pos);
      if (next_pos != parameter.size()) print_usage_and_exit(-1);
    } else if (arg == "--format") {
      std::string parameter = std::string(argv[++i]);
      if (parameter.rfind("lower", 0) == 0)
        format = LOWER_DISTANCE_MATRIX;
      else if (parameter.rfind("upper", 0) == 0)
        format = UPPER_DISTANCE_MATRIX;
      else if (parameter.rfind("dist", 0) == 0)
        format = DISTANCE_MATRIX;
      else if (parameter.rfind("point", 0) == 0)
        format = POINT_CLOUD;
      else if (parameter == "dipha")
        format = DIPHA;
      else if (parameter == "sparse")
        format = SPARSE;
      else if (parameter == "binary")
        format = BINARY;
      else
        print_usage_and_exit(-1);
    } else if (arg == "--modulus") {
      std::string parameter = std::string(argv[++i]);
      std::size_t next_pos;
      modulus = std::stol(parameter, &next_pos);
      if (next_pos != parameter.size() || !Gudhi::ripser::is_prime(modulus)) print_usage_and_exit(-1);
    } else {
      if (filename) { print_usage_and_exit(-1); }
      filename = argv[i];
    }
  }

  std::ifstream file_stream(filename);
  if (filename && file_stream.fail()) {
    std::cerr << "couldn't open file " << filename << std::endl;
    exit(-1);
  }

  auto output_dim = [](dimension_t dim) {
    std::cout << "persistence intervals in dim " << (int)dim << ":" << std::endl;
  };
  auto output_pair = [ratio](value_t birth, value_t death) {
#ifdef GUDHI_INDICATE_PROGRESS
    // Not necessary if we redirect stdout
    std::cerr << Gudhi::ripser::clear_line << std::flush;
#endif
    if (death == std::numeric_limits<value_t>::infinity())
      std::cout << " [" << birth << ", )" << std::endl;
    else if (death > birth * ratio)
      std::cout << " [" << birth << "," << death << ")" << std::endl;
  };
  if (format == SPARSE) {
    Sparse_distance_matrix dist =
      read_sparse_distance_matrix(filename ? file_stream : std::cin);
    std::cout << "sparse distance matrix with " << dist.size() << " points and "
      << dist.num_edges << "/" << (dist.size() * (dist.size() - 1)) / 2 << " entries"
      << std::endl;

    ripser(std::move(dist), dim_max, threshold, modulus, output_dim, output_pair);
  } else if (format == POINT_CLOUD && threshold < std::numeric_limits<value_t>::max()) {
    Sparse_distance_matrix dist(read_point_cloud(filename ? file_stream : std::cin), threshold);
    ripser(std::move(dist), dim_max, threshold, modulus, output_dim, output_pair);
  } else {
    Compressed_lower_distance_matrix dist =
      read_file(filename ? file_stream : std::cin, format);

    value_t min = std::numeric_limits<value_t>::infinity(),
            max = -std::numeric_limits<value_t>::infinity(), max_finite = max;
    std::size_t num_edges = 0;

    value_t enclosing_radius = std::numeric_limits<value_t>::infinity();
    if (threshold >= std::numeric_limits<value_t>::max()) {
      for (vertex_t i = 0; i < dist.size(); ++i) {
        value_t r_i = -std::numeric_limits<value_t>::infinity();
        for (vertex_t j = 0; j < dist.size(); ++j) r_i = std::max(r_i, dist(i, j));
        enclosing_radius = std::min(enclosing_radius, r_i);
      }
    }

    for (auto d : dist.distances) {
      min = std::min(min, d);
      max = std::max(max, d);
      if (d != std::numeric_limits<value_t>::infinity()) max_finite = std::max(max_finite, d);
      if (d <= threshold) ++num_edges;
    }
    std::cout << "value range: [" << min << "," << max_finite << "]" << std::endl;

    if (threshold >= std::numeric_limits<value_t>::max()) {
      std::cout << "distance matrix with " << dist.size()
        << " points, using threshold at enclosing radius " << enclosing_radius
        << std::endl;
      ripser(std::move(dist), dim_max, enclosing_radius, modulus, output_dim, output_pair);
    } else {
      std::cout << "sparse distance matrix with " << dist.size() << " points and "
        << num_edges << "/" << (dist.size() * (dist.size() - 1)) / 2 << " entries"
        << std::endl;

      ripser(Sparse_distance_matrix(std::move(dist), threshold), dim_max, threshold, modulus, output_dim, output_pair);
    }
  }
  return 0;
}